

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestTable::testTable(TestTable *this)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  TableViewSection *pTVar6;
  TableViewCell *pTVar7;
  QPoint *pQVar8;
  QWidget *pQVar9;
  QRect r;
  QPoint p;
  QPoint local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_40.xp = 200;
  local_40.yp = 400;
  QWidget::resize((QSize *)(this->m_v).value);
  QWidget::show();
  bVar2 = (bool)QTest::qWaitForWindowActive((QWidget *)(this->m_v).value,5000);
  cVar3 = QTest::qVerify(bVar2,"QTest::qWaitForWindowActive( m_v.data() )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                         ,0x68);
  if (cVar3 != '\0') {
    pTVar6 = QtMWidgets::TableView::sectionAt((this->m_v).value,0);
    cVar3 = QTest::qVerify(pTVar6 == this->m_ringerAndAlerts,
                           "m_v->sectionAt( 0 ) == m_ringerAndAlerts","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                           ,0x6a);
    if (cVar3 != '\0') {
      pTVar6 = QtMWidgets::TableView::sectionAt((this->m_v).value,1);
      cVar3 = QTest::qVerify(pTVar6 == this->m_sounds,"m_v->sectionAt( 1 ) == m_sounds","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                             ,0x6b);
      if (cVar3 != '\0') {
        bVar2 = QtMWidgets::TableView::highlightCellOnClick((this->m_v).value);
        cVar3 = QTest::qVerify(bVar2,"m_v->highlightCellOnClick() == true","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                               ,0x6d);
        if (cVar3 != '\0') {
          bVar2 = QtMWidgets::TableViewSection::highlightCellOnClick(this->m_ringerAndAlerts);
          cVar3 = QTest::qVerify(bVar2,"m_ringerAndAlerts->highlightCellOnClick() == true","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                 ,0x6e);
          if (cVar3 != '\0') {
            iVar4 = QtMWidgets::TableViewSection::cellsCount(this->m_ringerAndAlerts);
            cVar3 = QTest::qVerify(iVar4 == 2,"m_ringerAndAlerts->cellsCount() == 2","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                   ,0x70);
            if (cVar3 != '\0') {
              pTVar7 = QtMWidgets::TableViewSection::cellAt(this->m_ringerAndAlerts,0);
              cVar3 = QTest::qVerify(pTVar7 == this->m_volume,
                                     "m_ringerAndAlerts->cellAt( 0 ) == m_volume","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                     ,0x71);
              if (cVar3 != '\0') {
                bVar2 = QtMWidgets::TableViewCell::highlightOnClick(this->m_volume);
                cVar3 = QTest::qVerify(bVar2,"m_volume->highlightOnClick() == true","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                       ,0x72);
                if (cVar3 != '\0') {
                  QtMWidgets::ScrollArea::ensureWidgetVisible
                            (&((this->m_v).value)->super_ScrollArea,
                             &this->m_facebookPost->super_QWidget,0x32,0x32);
                  QTest::qWait(0x226);
                  pTVar6 = this->m_sounds;
                  pQVar8 = (QPoint *)
                           QtMWidgets::AbstractScrollArea::viewport
                                     ((AbstractScrollArea *)(this->m_v).value);
                  local_40 = (QPoint)QWidget::pos();
                  local_30 = QWidget::mapTo(&pTVar6->super_QWidget,pQVar8);
                  pQVar9 = QtMWidgets::AbstractScrollArea::viewport
                                     ((AbstractScrollArea *)(this->m_v).value);
                  lVar1 = *(long *)(pQVar9 + 0x20);
                  local_38 = CONCAT44(*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18),
                                      *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14));
                  local_40.xp = 0;
                  local_40.yp = 0;
                  bVar2 = (bool)QRect::contains(&local_40,SUB81(&local_30,0));
                  cVar3 = QTest::qVerify(bVar2,"r.contains( p )","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                         ,0x7c);
                  if (cVar3 != '\0') {
                    iVar4 = QtMWidgets::TableViewSection::cellsCount(this->m_sounds);
                    QtMWidgets::TableViewSection::removeCell(this->m_sounds,this->m_facebookPost);
                    QObject::deleteLater();
                    QTest::qWait(0x32);
                    iVar5 = QtMWidgets::TableViewSection::cellsCount(this->m_sounds);
                    cVar3 = QTest::qVerify(iVar5 == iVar4 + -1,"m_sounds->cellsCount() == cc - 1",""
                                           ,
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                           ,0x86);
                    if (cVar3 != '\0') {
                      QtMWidgets::TableView::removeSection((this->m_v).value,this->m_sounds);
                      QObject::deleteLater();
                      iVar4 = QtMWidgets::TableView::sectionsCount((this->m_v).value);
                      cVar3 = QTest::qVerify(iVar4 == 1,"m_v->sectionsCount() == 1","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                             ,0x8c);
                      if (cVar3 != '\0') {
                        QTest::qWait(0x32);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void testTable()
	{
		m_v->resize( 200, 400 );
		m_v->show();

		QVERIFY( QTest::qWaitForWindowActive( m_v.data() ) );

		QVERIFY( m_v->sectionAt( 0 ) == m_ringerAndAlerts );
		QVERIFY( m_v->sectionAt( 1 ) == m_sounds );

		QVERIFY( m_v->highlightCellOnClick() == true );
		QVERIFY( m_ringerAndAlerts->highlightCellOnClick() == true );

		QVERIFY( m_ringerAndAlerts->cellsCount() == 2 );
		QVERIFY( m_ringerAndAlerts->cellAt( 0 ) == m_volume );
		QVERIFY( m_volume->highlightOnClick() == true );

		m_v->ensureWidgetVisible( m_facebookPost );

		QTest::qWait( 550 );

		const auto p = m_sounds->mapTo( m_v->viewport(), m_facebookPost->pos() );

		const QRect r = m_v->viewport()->rect();

		QVERIFY( r.contains( p ) );

		const auto cc = m_sounds->cellsCount();

		m_sounds->removeCell( m_facebookPost );

		m_facebookPost->deleteLater();

		QTest::qWait( 50 );

		QVERIFY( m_sounds->cellsCount() == cc - 1 );

		m_v->removeSection( m_sounds );

		m_sounds->deleteLater();

		QVERIFY( m_v->sectionsCount() == 1 );

		QTest::qWait( 50 );
	}